

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_vector3.h
# Opt level: O0

_vector3<double> * __thiscall
xray_re::_vector3<double>::transform(_vector3<double> *this,_matrix<double> *m)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double _y;
  double _x;
  _matrix<double> *m_local;
  _vector3<double> *this_local;
  
  dVar1 = (m->field_0).field_0._41;
  dVar2 = (m->field_0).field_0._11;
  dVar3 = (m->field_0).field_0._21;
  dVar4 = (m->field_0).field_0._31;
  dVar5 = (this->field_0).field_0.z;
  dVar6 = (m->field_0).field_0._42;
  dVar7 = (m->field_0).field_0._12;
  dVar8 = (this->field_0).field_0.x;
  dVar9 = (m->field_0).field_0._22;
  dVar10 = (m->field_0).field_0._32;
  dVar11 = (this->field_0).field_0.z;
  (this->field_0).field_0.z =
       (m->field_0).field_0._33 * (this->field_0).field_0.z +
       (m->field_0).field_0._23 * (this->field_0).field_0.y +
       (m->field_0).field_0._13 * (this->field_0).field_0.x + (m->field_0).field_0._43;
  (this->field_0).field_0.x =
       dVar4 * dVar5 + dVar3 * (this->field_0).field_0.y + dVar2 * (this->field_0).field_0.x + dVar1
  ;
  (this->field_0).field_0.y =
       dVar10 * dVar11 + dVar9 * (this->field_0).field_0.y + dVar7 * dVar8 + dVar6;
  return this;
}

Assistant:

inline _vector3<T>& _vector3<T>::transform(const _matrix<T>& m)
{
	T _x = m._41 + m._11*x + m._21*y + m._31*z;
	T _y = m._42 + m._12*x + m._22*y + m._32*z;
	z = m._43 + m._13*x + m._23*y + m._33*z;
	x = _x;
	y = _y;
	return *this;
}